

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::vector<unsigned_char>_>::~vector
          (vector<basisu::vector<unsigned_char>_> *this)

{
  if (this->m_p != (vector<unsigned_char> *)0x0) {
    destruct_array<basisu::vector<unsigned_char>>(this->m_p,(ulong)this->m_size);
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }